

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O3

int archive_compressor_xz_options(archive_write_filter *f,char *key,char *value)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *in_RAX;
  int *piVar5;
  ulong uVar6;
  char *endptr;
  char *local_28;
  
  puVar1 = (uint *)f->data;
  local_28 = in_RAX;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    iVar2 = -0x14;
    if (((value != (char *)0x0) && ((byte)(*value - 0x30U) < 10)) && (value[1] == '\0')) {
      *puVar1 = (uint)(byte)(*value - 0x30U);
      iVar2 = 0;
    }
  }
  else {
    iVar3 = strcmp(key,"threads");
    iVar2 = -0x14;
    if ((iVar3 == 0) && (value != (char *)0x0)) {
      piVar5 = __errno_location();
      *piVar5 = 0;
      uVar6 = strtoul(value,&local_28,10);
      puVar1[1] = (uint)uVar6;
      iVar2 = -0x14;
      uVar4 = 1;
      if ((*piVar5 == 0) && (*local_28 == '\0')) {
        if ((uint)uVar6 != 0) {
          return 0;
        }
        iVar2 = 0;
        uVar4 = lzma_cputhreads();
      }
      puVar1[1] = uVar4;
    }
  }
  return iVar2;
}

Assistant:

static int
archive_compressor_xz_options(struct archive_write_filter *f,
    const char *key, const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		if (data->compression_level > 9)
			data->compression_level = 9;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		char *endptr;

		if (value == NULL)
			return (ARCHIVE_WARN);
		errno = 0;
		data->threads = (int)strtoul(value, &endptr, 10);
		if (errno != 0 || *endptr != '\0') {
			data->threads = 1;
			return (ARCHIVE_WARN);
		}
		if (data->threads == 0) {
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
			data->threads = lzma_cputhreads();
#else
			data->threads = 1;
#endif
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}